

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::StringData> *value)

{
  bool bVar1;
  undefined1 local_58 [8];
  StringData v;
  optional<tinyusdz::value::StringData> *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::StringData>::operator=(value);
    this_local._7_1_ = true;
  }
  else {
    tinyusdz::value::StringData::StringData((StringData *)local_58);
    this_local._7_1_ = ReadBasicType(this,(StringData *)local_58);
    if (this_local._7_1_) {
      nonstd::optional_lite::optional<tinyusdz::value::StringData>::operator=
                (value,(StringData *)local_58);
    }
    tinyusdz::value::StringData::~StringData((StringData *)local_58);
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::StringData> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::StringData v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}